

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

string * __thiscall
rcg::Interface::getDisplayName_abi_cxx11_(string *__return_storage_ptr__,Interface *this)

{
  INTERFACE_INFO_CMD in_R8D;
  
  std::mutex::lock(&this->mtx);
  (anonymous_namespace)::cIFGetInfo_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Interface *)&this->gentl,
             (shared_ptr<const_rcg::GenTLWrapper> *)0x1,in_R8D);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::string Interface::getDisplayName()
{
  std::lock_guard<std::mutex> lock(mtx);
  return cIFGetInfo(this, gentl, GenTL::INTERFACE_INFO_DISPLAYNAME);
}